

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.cpp
# Opt level: O0

ConversionResult
llvm::ConvertUTF32toUTF16
          (UTF32 **sourceStart,UTF32 *sourceEnd,UTF16 **targetStart,UTF16 *targetEnd,
          ConversionFlags flags)

{
  uint uVar1;
  UTF16 *pUVar2;
  UTF16 *pUStack_40;
  UTF32 ch;
  UTF16 *target;
  UTF32 *source;
  ConversionResult result;
  ConversionFlags flags_local;
  UTF16 *targetEnd_local;
  UTF16 **targetStart_local;
  UTF32 *sourceEnd_local;
  UTF32 **sourceStart_local;
  
  source._0_4_ = conversionOK;
  pUStack_40 = *targetStart;
  target = (UTF16 *)*sourceStart;
  do {
    if (sourceEnd <= target) {
LAB_00206c6e:
      *sourceStart = (UTF32 *)target;
      *targetStart = pUStack_40;
      return (ConversionResult)source;
    }
    if (targetEnd <= pUStack_40) {
      source._0_4_ = targetExhausted;
      goto LAB_00206c6e;
    }
    pUVar2 = target + 2;
    uVar1 = *(uint *)target;
    if (uVar1 < 0x10000) {
      if ((uVar1 < 0xd800) || (0xdfff < uVar1)) {
        *pUStack_40 = (UTF16)uVar1;
      }
      else {
        if (flags == strictConversion) {
          source._0_4_ = sourceIllegal;
          goto LAB_00206c6e;
        }
        *pUStack_40 = 0xfffd;
      }
      pUStack_40 = pUStack_40 + 1;
      target = pUVar2;
    }
    else if (uVar1 < 0x110000) {
      if (targetEnd <= pUStack_40 + 1) {
        source._0_4_ = targetExhausted;
        goto LAB_00206c6e;
      }
      *pUStack_40 = (short)(uVar1 - 0x10000 >> 10) + 0xd800;
      pUStack_40[1] = ((ushort)(uVar1 - 0x10000) & 0x3ff) + 0xdc00;
      pUStack_40 = pUStack_40 + 2;
      target = pUVar2;
    }
    else if (flags == strictConversion) {
      source._0_4_ = sourceIllegal;
      target = pUVar2;
    }
    else {
      *pUStack_40 = 0xfffd;
      pUStack_40 = pUStack_40 + 1;
      target = pUVar2;
    }
  } while( true );
}

Assistant:

ConversionResult ConvertUTF32toUTF16 (
        const UTF32** sourceStart, const UTF32* sourceEnd,
        UTF16** targetStart, UTF16* targetEnd, ConversionFlags flags) {
    ConversionResult result = conversionOK;
    const UTF32* source = *sourceStart;
    UTF16* target = *targetStart;
    while (source < sourceEnd) {
        UTF32 ch;
        if (target >= targetEnd) {
            result = targetExhausted; break;
        }
        ch = *source++;
        if (ch <= UNI_MAX_BMP) { /* Target is a character <= 0xFFFF */
            /* UTF-16 surrogate values are illegal in UTF-32; 0xffff or 0xfffe are both reserved values */
            if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_LOW_END) {
                if (flags == strictConversion) {
                    --source; /* return to the illegal value itself */
                    result = sourceIllegal;
                    break;
                } else {
                    *target++ = UNI_REPLACEMENT_CHAR;
                }
            } else {
                *target++ = (UTF16)ch; /* normal case */
            }
        } else if (ch > UNI_MAX_LEGAL_UTF32) {
            if (flags == strictConversion) {
                result = sourceIllegal;
            } else {
                *target++ = UNI_REPLACEMENT_CHAR;
            }
        } else {
            /* target is a character in range 0xFFFF - 0x10FFFF. */
            if (target + 1 >= targetEnd) {
                --source; /* Back up source pointer! */
                result = targetExhausted; break;
            }
            ch -= halfBase;
            *target++ = (UTF16)((ch >> halfShift) + UNI_SUR_HIGH_START);
            *target++ = (UTF16)((ch & halfMask) + UNI_SUR_LOW_START);
        }
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}